

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O2

void BinarySource_REWIND_TO__(BinarySource *src,size_t pos)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = src->len;
  sVar2 = pos;
  if (uVar1 < pos) {
    sVar2 = uVar1;
  }
  src->pos = sVar2;
  src->err = (uint)(uVar1 < pos);
  return;
}

Assistant:

void BinarySource_REWIND_TO__(BinarySource *src, size_t pos)
{
    if (pos <= src->len) {
        src->pos = pos;
        src->err = BSE_NO_ERROR;    /* clear any existing error */
    } else {
        src->pos = src->len;
        src->err = BSE_OUT_OF_DATA; /* new error if we rewind out of range */
    }
}